

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O1

int set_insert_array(set s,set_key *keys,set_value *values,size_t size)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_t sVar4;
  
  if (values == (set_value *)0x0 || (keys == (set_key *)0x0 || s == (set)0x0)) {
    pcVar3 = "Invalid set array insertion parameters";
    uVar2 = 0xef;
LAB_00102849:
    log_write_impl_va("metacall",uVar2,"set_insert_array",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                      ,3,pcVar3);
    iVar1 = 1;
  }
  else {
    if (size != 0) {
      sVar4 = 0;
      do {
        iVar1 = set_insert(s,keys[sVar4],values[sVar4]);
        if (iVar1 != 0) {
          pcVar3 = "Invalid set array insertion";
          uVar2 = 0xf7;
          goto LAB_00102849;
        }
        sVar4 = sVar4 + 1;
      } while (size != sVar4);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int set_insert_array(set s, set_key keys[], set_value values[], size_t size)
{
	size_t iterator;

	if (s == NULL || keys == NULL || values == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set array insertion parameters");
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (set_insert(s, keys[iterator], values[iterator]) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid set array insertion");
			return 1;
		}
	}

	return 0;
}